

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcDimensionCurveTerminator::~IfcDimensionCurveTerminator
          (IfcDimensionCurveTerminator *this)

{
  _func_int **pp_Var1;
  undefined1 *puVar2;
  void *pvVar3;
  
  this[-1].super_IfcTerminatorSymbol.super_IfcAnnotationSymbolOccurrence.
  super_IfcAnnotationOccurrence.super_IfcStyledItem.Name.ptr._M_dataplus._M_p = "\x10YW";
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x20 = 0x8a2158;
  this[-1].super_IfcTerminatorSymbol.super_IfcAnnotationSymbolOccurrence.
  super_IfcAnnotationOccurrence.super_IfcStyledItem.Name.ptr.field_2._M_allocated_capacity =
       0x8a2090;
  *(undefined8 *)&this[-1].super_IfcTerminatorSymbol.field_0xb8 = 0x8a20b8;
  *(undefined8 *)&this[-1].field_0xc8 = 0x8a20e0;
  *(undefined8 *)&this[-1].field_0xd8 = 0x8a2108;
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem = 0x8a2130;
  pp_Var1 = (this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
            super_IfcAnnotationOccurrence.super_IfcStyledItem.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper;
  if (pp_Var1 !=
      (_func_int **)
      &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
       super_IfcAnnotationOccurrence.super_IfcStyledItem.
       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x10) {
    operator_delete(pp_Var1);
  }
  this[-1].super_IfcTerminatorSymbol.super_IfcAnnotationSymbolOccurrence.
  super_IfcAnnotationOccurrence.super_IfcStyledItem.Name.ptr._M_dataplus._M_p = (pointer)0x8a2510;
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x20 = 0x8a2560;
  this[-1].super_IfcTerminatorSymbol.super_IfcAnnotationSymbolOccurrence.
  super_IfcAnnotationOccurrence.super_IfcStyledItem.Name.ptr.field_2._M_allocated_capacity =
       0x8a2538;
  puVar2 = *(undefined1 **)
            &this[-1].super_IfcTerminatorSymbol.super_IfcAnnotationSymbolOccurrence.
             super_IfcAnnotationOccurrence.field_0x90;
  if (puVar2 != &this[-1].super_IfcTerminatorSymbol.super_IfcAnnotationSymbolOccurrence.field_0xa0)
  {
    operator_delete(puVar2);
  }
  pvVar3 = *(void **)&this[-1].super_IfcTerminatorSymbol.super_IfcAnnotationSymbolOccurrence.
                      super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x78;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3);
    return;
  }
  return;
}

Assistant:

IfcDimensionCurveTerminator() : Object("IfcDimensionCurveTerminator") {}